

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void __thiscall RenderTarget::clear(RenderTarget *this)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  pointer ppRVar4;
  pointer ppRVar5;
  ulong uVar6;
  ulong uVar7;
  pointer this_00;
  
  ppRVar4 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar5 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppRVar5 != ppRVar4) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      if (ppRVar4[uVar6] != (Renderable *)0x0) {
        (*ppRVar4[uVar6]->_vptr_Renderable[1])();
        ppRVar4 = (this->objects).
                  super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppRVar5 = (this->objects).
                  super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      bVar3 = uVar7 < (ulong)((long)ppRVar5 - (long)ppRVar4 >> 3);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar3);
  }
  pPVar1 = (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      nite::Program::~Program(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
    ppRVar4 = (this->objects).
              super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppRVar5 = (this->objects).
              super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (ppRVar5 != ppRVar4) {
    (this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppRVar4;
  }
  return;
}

Assistant:

void clear(){
		for(unsigned i=0; i<objects.size(); i++){
			//objects[i]->~Renderable();
			delete objects[i];
		}
		programs.clear();
		objects.clear();
	}